

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O1

TCHAR * CombinePathAndString(TCHAR *szPath,char *szString,size_t nLength)

{
  TCHAR *szSubDir;
  TCHAR *pTVar1;
  
  szSubDir = (TCHAR *)malloc(nLength + 1);
  if (szSubDir == (TCHAR *)0x0) {
    pTVar1 = (TCHAR *)0x0;
  }
  else {
    memcpy(szSubDir,szString,nLength);
    szSubDir[nLength] = '\0';
    pTVar1 = CombinePath(szPath,szSubDir);
    free(szSubDir);
  }
  return pTVar1;
}

Assistant:

TCHAR * CombinePathAndString(const TCHAR * szPath, const char * szString, size_t nLength)
{
    TCHAR * szFullPath = NULL;
    TCHAR * szSubDir;

    // Create the subdir string
    szSubDir = CASC_ALLOC(TCHAR, nLength + 1);
    if(szSubDir != NULL)
    {
        CopyString(szSubDir, szString, nLength);
        szFullPath = CombinePath(szPath, szSubDir);
        CASC_FREE(szSubDir);
    }

    return szFullPath;
}